

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# web_peer_connection.cpp
# Opt level: O1

void __thiscall
libtorrent::aux::web_peer_connection::handle_error(web_peer_connection *this,int bytes_left)

{
  _Atomic_word *p_Var1;
  int iVar2;
  uint uVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  int iVar5;
  optional<std::chrono::duration<int,_std::ratio<1L,_1L>_>_> retry;
  alert_manager *paVar6;
  long *plVar7;
  error_category *peVar8;
  size_type *psVar9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *this_01;
  bool bVar10;
  undefined1 uVar11;
  string_view key;
  string error_msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  undefined1 local_68 [40];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  this_01 = (this->super_web_connection_base).super_peer_connection.
            super_peer_connection_hot_members.m_torrent.
            super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var4 = (this->super_web_connection_base).super_peer_connection.super_peer_connection_hot_members
           .m_torrent.super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  this_00 = p_Var4;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var4->_M_weak_count = p_Var4->_M_weak_count + 1;
      UNLOCK();
    }
    else {
      p_Var4->_M_weak_count = p_Var4->_M_weak_count + 1;
    }
    if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      iVar5 = p_Var4->_M_use_count;
      do {
        this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        if (iVar5 == 0) break;
        LOCK();
        iVar2 = p_Var4->_M_use_count;
        bVar10 = iVar5 == iVar2;
        if (bVar10) {
          p_Var4->_M_use_count = iVar5 + 1;
          iVar2 = iVar5;
        }
        iVar5 = iVar2;
        UNLOCK();
        this_00 = p_Var4;
      } while (!bVar10);
    }
  }
  if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    this_01 = (torrent *)0x0;
  }
  else if (this_00->_M_use_count == 0) {
    this_01 = (torrent *)0x0;
  }
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &p_Var4->_M_weak_count;
      iVar5 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar5 = p_Var4->_M_weak_count;
      p_Var4->_M_weak_count = iVar5 + -1;
    }
    if (iVar5 == 1) {
      (*p_Var4->_vptr__Sp_counted_base[3])();
    }
  }
  key._M_str = "retry-after";
  key._M_len = 0xb;
  retry = http_parser::header_duration(&(this->super_web_connection_base).m_parser,key);
  torrent::retry_web_seed(this_01,(peer_connection *)this,retry);
  paVar6 = torrent::alerts(this_01);
  if (((paVar6->m_alert_mask)._M_i.m_val & 3) != 0) {
    to_string((array<char,_22UL> *)local_68,
              (long)(this->super_web_connection_base).m_parser.m_status_code);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_68 + 0x18)," ",
                     &(this->super_web_connection_base).m_parser.m_server_message);
    strlen(local_68);
    plVar7 = (long *)::std::__cxx11::string::replace
                               ((ulong)(local_68 + 0x18),0,(char *)0x0,(ulong)local_68);
    psVar9 = (size_type *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_88.field_2._M_allocated_capacity = *psVar9;
      local_88.field_2._8_8_ = plVar7[3];
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    }
    else {
      local_88.field_2._M_allocated_capacity = *psVar9;
      local_88._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_88._M_string_length = plVar7[1];
    *plVar7 = (long)psVar9;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._24_8_ != &local_40) {
      operator_delete((void *)local_68._24_8_,local_40._M_allocated_capacity + 1);
    }
    paVar6 = torrent::alerts(this_01);
    torrent::get_handle((torrent *)local_68);
    alert_manager::
    emplace_alert<libtorrent::url_seed_alert,libtorrent::torrent_handle,std::__cxx11::string&,std::__cxx11::string_const&>
              (paVar6,(torrent_handle *)local_68,&this->m_url,&local_88);
    if ((__uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
         )local_68._8_8_ !=
        (__uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
         )0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1 = (_Atomic_word *)(local_68._8_8_ + 0xc);
        iVar5 = *p_Var1;
        *p_Var1 = *p_Var1 + -1;
        UNLOCK();
      }
      else {
        iVar5 = *(_Atomic_word *)(local_68._8_8_ + 0xc);
        *(int *)(local_68._8_8_ + 0xc) = iVar5 + -1;
      }
      if (iVar5 == 1) {
        (*(code *)(((vector<piece_pos,_piece_index_t> *)local_68._8_8_)->
                  super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                  ).
                  super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                  ._M_impl.super__Vector_impl_data._M_start[3])();
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
  }
  peer_connection::received_bytes((peer_connection *)this,0,bytes_left);
  uVar3 = (this->super_web_connection_base).m_parser.m_status_code;
  peVar8 = http_category();
  local_88._M_dataplus._M_p._0_4_ = uVar3;
  if ((peVar8->id_ == 0xb2ab117a257edf0d) || (peVar8->id_ == 0x8fafd21e25c5e09b)) {
    uVar11 = uVar3 != 0;
  }
  else {
    iVar5 = (*peVar8->_vptr_error_category[6])(peVar8,(ulong)uVar3);
    uVar11 = (undefined1)iVar5;
  }
  local_88._M_dataplus._M_p._4_1_ = uVar11;
  local_88._M_string_length = (size_type)peVar8;
  (*(this->super_web_connection_base).super_peer_connection.super_bandwidth_socket.
    _vptr_bandwidth_socket[0x14])(this,&local_88,1,1);
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return;
}

Assistant:

void web_peer_connection::handle_error(int const bytes_left)
{
	auto t = associated_torrent().lock();
	TORRENT_ASSERT(t);

	// TODO: 2 just make this peer not have the pieces
	// associated with the file we just requested. Only
	// when it doesn't have any of the file do the following
	// pad files will make it complicated

	// temporarily unavailable, retry later
	t->retry_web_seed(this, m_parser.header_duration("retry-after"));
	if (t->alerts().should_post<url_seed_alert>())
	{
		std::string const error_msg = to_string(m_parser.status_code()).data()
			+ (" " + m_parser.message());
		t->alerts().emplace_alert<url_seed_alert>(t->get_handle(), m_url
			, error_msg);
	}
	received_bytes(0, bytes_left);
	disconnect(error_code(m_parser.status_code(), http_category()), operation_t::bittorrent, failure);
}